

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_creader_add(Curl_easy *data,Curl_creader *reader)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  Curl_creader **ppCVar3;
  
  if (((data->req).reader_stack == (Curl_creader *)0x0) &&
     (CVar2 = Curl_creader_set_fread(data,(data->state).infilesize), CVar2 != CURLE_OK)) {
    return CVar2;
  }
  ppCVar3 = &(data->req).reader_stack;
  while ((pCVar1 = *ppCVar3, pCVar1 != (Curl_creader *)0x0 && (pCVar1->phase < reader->phase))) {
    ppCVar3 = &pCVar1->next;
  }
  reader->next = pCVar1;
  *ppCVar3 = reader;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_creader_add(struct Curl_easy *data,
                          struct Curl_creader *reader)
{
  CURLcode result;
  struct Curl_creader **anchor = &data->req.reader_stack;

  if(!*anchor) {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
  }

  /* Insert the writer as first in its phase.
   * Skip existing readers of lower phases. */
  while(*anchor && (*anchor)->phase < reader->phase)
    anchor = &((*anchor)->next);
  reader->next = *anchor;
  *anchor = reader;
  return CURLE_OK;
}